

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

MAFSA_automaton MAFSA_automaton_attach(void *ptr_nodes,void *ptr_links,int *error)

{
  undefined4 *in_RDX;
  uint32_t *in_RSI;
  uint32_t *in_RDI;
  MAFSA_automaton ret_data;
  MAFSA_automaton local_8;
  
  local_8 = (MAFSA_automaton)malloc(0x18);
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  if (local_8 == (MAFSA_automaton)0x0) {
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = 1;
    }
    local_8 = (MAFSA_automaton)0x0;
  }
  else {
    local_8->ptr_nodes = in_RDI;
    local_8->ptr_links = in_RSI;
    local_8->shared = 1;
  }
  return local_8;
}

Assistant:

extern MAFSA_automaton MAFSA_automaton_attach(const void *ptr_nodes, const void *ptr_links, int *error)
{
    MAFSA_automaton ret_data = (MAFSA_automaton)malloc(sizeof(struct MAFSA_automaton_struct));
    if (error) *error = 0;

    if (0 == ret_data)
    {
        if (error) *error = MAFSA_ERROR_NOMEM;
        return 0;
    }

    ret_data->ptr_nodes = (uint32_t *) ptr_nodes;
    ret_data->ptr_links = (uint32_t *) ptr_links;
    ret_data->shared = 1;

    return ret_data;
}